

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::Image(ImTextureID user_texture_id,ImVec2 *size,ImVec2 *uv0,ImVec2 *uv1,ImVec4 *tint_col,
                 ImVec4 *border_col)

{
  ImGuiWindow *pIVar1;
  bool bVar2;
  ImU32 IVar3;
  ImVec2 *p_max;
  ImRect *p_min;
  ImDrawList *this;
  ImRect local_58;
  ImVec2 *local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  if (pIVar1->SkipItems == false) {
    local_58.Min.x = (pIVar1->DC).CursorPos.x;
    local_58.Min.y = (pIVar1->DC).CursorPos.y;
    local_58.Max.x = (*size).x + local_58.Min.x;
    local_58.Max.y = (*size).y + local_58.Min.y;
    if (0.0 < border_col->w) {
      local_58.Max.x = local_58.Max.x + 2.0;
      local_58.Max.y = local_58.Max.y + 2.0;
    }
    local_48 = uv1;
    ItemSize(&local_58,-1.0);
    bVar2 = ItemAdd(&local_58,0,(ImRect *)0x0,0);
    if (bVar2) {
      this = pIVar1->DrawList;
      if (border_col->w <= 0.0) {
        IVar3 = GetColorU32(tint_col);
        p_min = &local_58;
        p_max = &local_58.Max;
      }
      else {
        IVar3 = GetColorU32(border_col);
        ImDrawList::AddRect(this,&local_58.Min,&local_58.Max,IVar3,0.0,0,1.0);
        this = pIVar1->DrawList;
        p_min = (ImRect *)&local_38;
        local_38.y = local_58.Min.y + 1.0;
        local_38.x = local_58.Min.x + 1.0;
        local_40.x = local_58.Max.x + -1.0;
        local_40.y = local_58.Max.y + -1.0;
        p_max = &local_40;
        IVar3 = GetColorU32(tint_col);
      }
      ImDrawList::AddImage(this,user_texture_id,&p_min->Min,p_max,uv0,local_48,IVar3);
    }
  }
  return;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* format, const char* format_max, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    float min_min = (v_min >= v_max) ? -FLT_MAX : v_min;
    float min_max = (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max);
    ImGuiSliderFlags min_flags = flags | ((min_min == min_max) ? ImGuiSliderFlags_ReadOnly : 0);
    bool value_changed = DragScalar("##min", ImGuiDataType_Float, v_current_min, v_speed, &min_min, &min_max, format, min_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    float max_min = (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min);
    float max_max = (v_min >= v_max) ? FLT_MAX : v_max;
    ImGuiSliderFlags max_flags = flags | ((max_min == max_max) ? ImGuiSliderFlags_ReadOnly : 0);
    value_changed |= DragScalar("##max", ImGuiDataType_Float, v_current_max, v_speed, &max_min, &max_max, format_max ? format_max : format, max_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}